

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void xmrig::Buffer::toHex(uint8_t *in,size_t size,uint8_t *out)

{
  uint8_t uVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    uVar1 = hf_bin2hex((uint8_t)((int)(*(byte *)(in_RDI + local_20) & 0xf0) >> 4));
    *(uint8_t *)(CONCAT71(in_register_00000011,in_DL) + local_20 * 2) = uVar1;
    uVar1 = hf_bin2hex(*(byte *)(in_RDI + local_20) & 0xf);
    *(uint8_t *)(CONCAT71(in_register_00000011,in_DL) + 1 + local_20 * 2) = uVar1;
  }
  return;
}

Assistant:

void xmrig::Buffer::toHex(const uint8_t *in, size_t size, uint8_t *out)
{
    for (size_t i = 0; i < size; i++) {
        out[i * 2]     = hf_bin2hex((in[i] & 0xF0) >> 4);
        out[i * 2 + 1] = hf_bin2hex(in[i] & 0x0F);
    }
}